

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O2

void __thiscall CDirectiveData::encodeNormal(CDirectiveData *this)

{
  vector<long,_std::allocator<long>_> *this_00;
  char cVar1;
  pointer plVar2;
  pointer pEVar3;
  byte bVar4;
  CDirectiveData *pCVar5;
  int32_t iVar6;
  size_t l;
  ulong uVar7;
  char *text;
  ulong uVar8;
  int64_t num;
  CDirectiveData *local_68;
  ExpressionValue value;
  
  plVar2 = (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar2) {
    (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar2;
  }
  this_00 = &this->normalData;
  uVar8 = 0;
  local_68 = this;
  do {
    pCVar5 = local_68;
    pEVar3 = (local_68->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)(((long)(local_68->entries).
                       super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pEVar3) / 0x18) <= uVar8) {
      if (local_68->writeTermination != false) {
        value.type = Invalid;
        value._4_4_ = 0;
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(this_00,(long *)&value);
      }
      return;
    }
    Expression::evaluate(&value,pEVar3 + uVar8);
    text = "Invalid expression";
    if (value.type == Invalid) {
LAB_0017338d:
      Logger::queueError<>(Error,text);
    }
    else if (value.type == Integer) {
      num = value.field_1.intValue;
      std::vector<long,_std::allocator<long>_>::push_back(this_00,&num);
    }
    else if (value.type == String) {
      bVar4 = 0;
      for (uVar7 = 0; uVar7 < value.strValue._value._M_string_length; uVar7 = uVar7 + 1) {
        cVar1 = value.strValue._value._M_dataplus._M_p[uVar7];
        num = (int64_t)cVar1;
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(this_00,&num);
        if (!(bool)(-1 < cVar1 | bVar4)) {
          bVar4 = 1;
          Logger::queueError<>(Error,"Non-ASCII character in data directive. Use .string instead");
        }
      }
    }
    else if (pCVar5->mode == U32 && (value.type ^ Float) == Invalid) {
      iVar6 = getFloatBits((float)value.field_1.floatValue);
      num = (int64_t)iVar6;
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(this_00,&num);
    }
    else {
      text = "Invalid expression type";
      if ((value.type ^ Float) != Invalid || pCVar5->mode != U64) goto LAB_0017338d;
      num = getDoubleBits(value.field_1.floatValue);
      std::vector<long,_std::allocator<long>_>::push_back(this_00,&num);
    }
    std::__cxx11::string::~string((string *)&value.strValue);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void CDirectiveData::encodeNormal()
{
	normalData.clear();
	for (size_t i = 0; i < entries.size(); i++)
	{
		ExpressionValue value = entries[i].evaluate();
		if (!value.isValid())
		{
			Logger::queueError(Logger::Error, "Invalid expression");
			continue;
		}

		if (value.isString())
		{
			bool hadNonAscii = false;
			for (size_t l = 0; l < value.strValue.size(); l++)
			{
				uint64_t num = value.strValue.string()[l];
				normalData.push_back(num);

				if (num >= 0x80 && !hadNonAscii)
				{
					Logger::queueError(Logger::Error, "Non-ASCII character in data directive. Use .string instead");
					hadNonAscii = true;
				}
			}
		} else if (value.isInt())
		{
			int64_t num = value.intValue;
			normalData.push_back(num);
		} else if (value.isFloat() && mode == EncodingMode::U32)
		{
			int32_t num = getFloatBits((float)value.floatValue);
			normalData.push_back(num);
		} else if(value.isFloat() && mode == EncodingMode::U64) {
			int64_t num = getDoubleBits((double)value.floatValue);
			normalData.push_back(num);
		} else {
			Logger::queueError(Logger::Error, "Invalid expression type");
		}
	}

	if (writeTermination)
	{
		normalData.push_back(0);
	}
}